

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPointer<QMdiSubWindow>_>::copyAppend
          (QGenericArrayOps<QPointer<QMdiSubWindow>_> *this,QPointer<QMdiSubWindow> *b,
          QPointer<QMdiSubWindow> *e)

{
  QPointer<QMdiSubWindow> *pQVar1;
  Data *pDVar2;
  long lVar3;
  
  if (b != e) {
    pQVar1 = (this->super_QArrayDataPointer<QPointer<QMdiSubWindow>_>).ptr;
    for (; b < e; b = b + 1) {
      lVar3 = (this->super_QArrayDataPointer<QPointer<QMdiSubWindow>_>).size;
      pDVar2 = (b->wp).d;
      pQVar1[lVar3].wp.d = pDVar2;
      pQVar1[lVar3].wp.value = (b->wp).value;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar2 = *(int *)pDVar2 + 1;
        UNLOCK();
        lVar3 = (this->super_QArrayDataPointer<QPointer<QMdiSubWindow>_>).size;
      }
      (this->super_QArrayDataPointer<QPointer<QMdiSubWindow>_>).size = lVar3 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }